

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_52e64::CustomAPNGAsmListener::onPostAddFrame
          (CustomAPNGAsmListener *this,APNGFrame *frame)

{
  uint uVar1;
  ostream *poVar2;
  APNGFrame *tmp;
  APNGFrame *frame_local;
  CustomAPNGAsmListener *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"New Frame => Delay=(");
  uVar1 = apngasm::APNGFrame::delayNum((uint)frame);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  poVar2 = std::operator<<(poVar2,"/");
  uVar1 = apngasm::APNGFrame::delayDen((uint)frame);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  poVar2 = std::operator<<(poVar2,") sec");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void onPostAddFrame(const apngasm::APNGFrame &frame) const {
    apngasm::APNGFrame &tmp = const_cast<apngasm::APNGFrame &>(frame);
    std::cout << "New Frame => Delay=(" << tmp.delayNum() << "/"
              << tmp.delayDen() << ") sec" << std::endl;
  }